

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int __thiscall String::printf(String *this,char *__format,...)

{
  code *pcVar1;
  char in_AL;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined8 in_RCX;
  Data *pDVar5;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  detach(this,0,200);
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_e8;
  uVar2 = vsnprintf(this->data->str,this->data->capacity,__format,ap);
  if (-1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
    pDVar5 = this->data;
    if (uVar4 < pDVar5->capacity) goto LAB_00105acb;
  }
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_e8;
  uVar2 = vsnprintf((char *)0x0,0,__format,ap);
  if ((int)uVar2 < 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                          ,0x2c,"result >= 0");
    if (iVar3 == 0) {
      return -1;
    }
  }
  else {
    detach(this,0,(ulong)uVar2);
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].reg_save_area = local_e8;
    uVar2 = vsnprintf(this->data->str,(ulong)(uVar2 + 1),__format,ap);
    if ((-1 < (int)uVar2) ||
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                              ,0x33,"result >= 0"), iVar3 == 0)) {
      uVar4 = (ulong)(int)uVar2;
      pDVar5 = this->data;
LAB_00105acb:
      pDVar5->len = uVar4;
      return uVar2;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int String::printf(const char* format, ...)
{
  detach(0, 200);

  int result;
  va_list ap;
  va_start(ap, format);

  {
    result = vsnprintf((char*)data->str, data->capacity, format, ap);
    va_end(ap);
    if(result >= 0 && (usize)result < data->capacity)
    {
      data->len = result;
      return result;
    }
  }

  // buffer was too small: compute size, reserve buffer, print again
  {
    va_start(ap, format);
#ifdef _MSC_VER
    result = _vscprintf(format, ap);
#else
    result = vsnprintf(0, 0, format, ap);
#endif
    va_end(ap);
    ASSERT(result >= 0);
    if(result < 0)
      return -1;
    detach(0, result);
    va_start(ap, format);
    result = vsnprintf((char*)data->str, result + 1, format, ap);
    va_end(ap);
    ASSERT(result >= 0);
    data->len = result;
    va_end(ap);
    return result;
  }
}